

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::DragBehaviorT<double,double,double>
               (ImGuiDataType data_type,double *v,float v_speed,double v_min,double v_max,
               char *format,ImGuiSliderFlags flags)

{
  bool bVar1;
  double dVar2;
  ImGuiInputSource IVar3;
  undefined8 uVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  float fVar10;
  undefined1 auVar11 [16];
  float fVar12;
  undefined1 auVar13 [16];
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  float fVar18;
  undefined1 auVar19 [16];
  double dVar20;
  float local_80;
  undefined1 local_58 [16];
  undefined8 local_38;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  
  pIVar5 = GImGui;
  uVar9 = flags & 0x100000;
  if ((((v_speed == 0.0) && (!NAN(v_speed))) && (v_min < v_max)) &&
     (v_max - v_min < 3.4028234663852886e+38)) {
    dVar20 = (v_max - v_min) * (double)GImGui->DragSpeedDefaultRatio;
    in_XMM0_Db = (undefined4)((ulong)dVar20 >> 0x20);
    v_speed = (float)dVar20;
    in_XMM0_Dc = 0;
    in_XMM0_Dd = 0;
  }
  uVar8 = data_type & 0xfffffffe;
  local_58._4_4_ = in_XMM0_Db;
  local_58._0_4_ = v_speed;
  local_58._8_4_ = in_XMM0_Dc;
  local_58._12_4_ = in_XMM0_Dd;
  IVar3 = GImGui->ActiveIdSource;
  if (IVar3 == ImGuiInputSource_Mouse) {
    bVar6 = IsMousePosValid((ImVec2 *)0x0);
    if ((!bVar6) ||
       (bVar6 = IsMouseDragPastThreshold(0,(pIVar5->IO).MouseDragThreshold * 0.5), !bVar6)) {
      IVar3 = pIVar5->ActiveIdSource;
      goto LAB_00295857;
    }
    fVar10 = (pIVar5->IO).NavInputs[(ulong)(uVar9 >> 0x14) + 0x1c];
    bVar6 = (pIVar5->IO).KeyShift;
    bVar1 = (pIVar5->IO).KeyAlt;
    fVar10 = (float)((uint)(bVar1 & 1) * (int)(fVar10 * 0.01) +
                    (uint)!(bool)(bVar1 & 1) * (int)fVar10);
    fVar10 = (float)((uint)(bVar6 & 1) * (int)(fVar10 * 10.0) +
                    (uint)!(bool)(bVar6 & 1) * (int)fVar10);
  }
  else {
LAB_00295857:
    fVar10 = 0.0;
    if (IVar3 == ImGuiInputSource_Nav) {
      iVar7 = 0;
      if (uVar8 == 8) {
        iVar7 = ImParseFormatPrecision(format,3);
      }
      auVar14._0_8_ = GetNavInputAmount2d(6,ImGuiInputReadMode_RepeatFast,0.1,10.0);
      auVar14._8_56_ = extraout_var_00;
      local_38 = vmovlps_avx(auVar14._0_16_);
      fVar10 = *(float *)((long)&local_38 + (ulong)(uVar9 >> 0x14) * 4);
      auVar15._0_4_ = GetMinimumStepAtDecimalPrecision(iVar7);
      auVar15._4_60_ = extraout_var;
      uVar4 = vcmpss_avx512f(auVar15._0_16_,local_58,2);
      bVar6 = (bool)((byte)uVar4 & 1);
      v_speed = (float)((uint)bVar6 * (int)v_speed + (uint)!bVar6 * (int)auVar15._0_4_);
    }
  }
  auVar11._8_4_ = 0x80000000;
  auVar11._0_8_ = 0x8000000080000000;
  auVar11._12_4_ = 0x80000000;
  auVar11 = vxorps_avx512vl(ZEXT416((uint)(fVar10 * v_speed)),auVar11);
  fVar10 = (float)((uint)(uVar9 == 0) * (int)(fVar10 * v_speed) + (uint)(uVar9 != 0) * auVar11._0_4_
                  );
  if ((((flags & 0x20U) != 0) && (dVar20 = v_max - v_min, dVar20 < 3.4028234663852886e+38)) &&
     (9.999999974752427e-07 < dVar20)) {
    fVar10 = fVar10 / (float)dVar20;
  }
  if (v_min < v_max) {
    if ((v_max <= *v) && (0.0 < fVar10)) goto LAB_0029599e;
    bVar6 = fVar10 < 0.0 && *v <= v_min;
  }
  else {
    bVar6 = false;
  }
  if ((pIVar5->ActiveIdIsJustActivated == false) && (!bVar6)) {
    if ((fVar10 != 0.0) || (NAN(fVar10))) {
      pIVar5->DragCurrentAccum = fVar10 + pIVar5->DragCurrentAccum;
      pIVar5->DragCurrentAccumDirty = true;
    }
    else if ((pIVar5->DragCurrentAccumDirty & 1U) == 0) {
      return false;
    }
    dVar20 = *v;
    if ((flags & 0x20U) == 0) {
      auVar13._8_8_ = 0;
      auVar13._0_8_ = dVar20 + (double)pIVar5->DragCurrentAccum;
      local_80 = 0.0;
      fVar18 = 0.0;
    }
    else {
      if (uVar8 == 8) {
        iVar7 = ImParseFormatPrecision(format,3);
        fVar18 = (float)iVar7;
      }
      else {
        fVar18 = 1.0;
      }
      local_80 = powf(0.1,fVar18);
      fVar18 = ScaleRatioFromValueT<double,double,double>
                         (data_type,dVar20,v_min,v_max,true,local_80,0.0);
      auVar16._0_8_ =
           ScaleValueFromRatioT<double,double,double>
                     (data_type,fVar18 + pIVar5->DragCurrentAccum,v_min,v_max,true,local_80,0.0);
      auVar16._8_56_ = extraout_var_01;
      auVar13 = auVar16._0_16_;
    }
    if ((flags & 0x40U) == 0) {
      auVar17._0_8_ = RoundScalarWithFormatT<double,double>(format,data_type,auVar13._0_8_);
      auVar17._8_56_ = extraout_var_02;
      auVar13 = auVar17._0_16_;
    }
    pIVar5->DragCurrentAccumDirty = false;
    dVar20 = auVar13._0_8_;
    if ((flags & 0x20U) == 0) {
      dVar2 = *v;
      pIVar5->DragCurrentAccum = pIVar5->DragCurrentAccum - (float)(dVar20 - dVar2);
    }
    else {
      fVar12 = ScaleRatioFromValueT<double,double,double>
                         (data_type,dVar20,v_min,v_max,true,local_80,0.0);
      pIVar5->DragCurrentAccum = pIVar5->DragCurrentAccum - (fVar12 - fVar18);
      dVar2 = *v;
    }
    auVar19._0_12_ = ZEXT812(0);
    auVar19._12_4_ = 0;
    uVar4 = vcmpsd_avx512f(auVar13,auVar19,0);
    dVar20 = (double)((ulong)!(bool)((byte)uVar4 & 1) * (long)dVar20);
    if (v_min < v_max) {
      if ((dVar2 != dVar20) || (NAN(dVar2) || NAN(dVar20))) {
        if ((dVar20 < v_min) || (((uVar8 != 8 && (dVar2 < dVar20)) && (fVar10 < 0.0)))) {
          dVar20 = v_min;
        }
        if ((v_max < dVar20) || (((uVar8 != 8 && (dVar20 < dVar2)) && (0.0 < fVar10)))) {
          dVar20 = v_max;
        }
      }
    }
    if ((dVar2 == dVar20) && (!NAN(dVar2) && !NAN(dVar20))) {
      return false;
    }
    *v = dVar20;
    return true;
  }
LAB_0029599e:
  pIVar5->DragCurrentAccum = 0.0;
  pIVar5->DragCurrentAccumDirty = false;
  return false;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_clamped = (v_min < v_max);
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) != 0;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    // Default tweak speed
    if (v_speed == 0.0f && is_clamped && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && IsMouseDragPastThreshold(0, g.IO.MouseDragThreshold * DRAG_MOUSE_THRESHOLD_FACTOR))
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // For logarithmic use our range is effectively 0..1 so scale the delta into that range
    if (is_logarithmic && (v_max - v_min < FLT_MAX) && ((v_max - v_min) > 0.000001f)) // Epsilon to avoid /0
        adjust_delta /= (float)(v_max - v_min);

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = is_clamped && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    if (is_just_activated || is_already_past_limits_and_pushing_outward)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    const float zero_deadzone_halfsize = 0.0f; // Drag widgets have no deadzone (as it doesn't make sense)
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);

        // Convert to parametric space, apply delta, convert back
        float v_old_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        float v_new_parametric = v_old_parametric + g.DragCurrentAccum;
        v_cur = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new_parametric, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        v_old_ref_for_accum_remainder = v_old_parametric;
    }
    else
    {
        v_cur += (SIGNEDTYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
        v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_logarithmic)
    {
        // Convert to parametric space, apply delta, convert back
        float v_new_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        g.DragCurrentAccum -= (float)(v_new_parametric - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && is_clamped)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_floating_point))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_floating_point))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}